

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O1

void __thiscall Assimp::D3DS::Node::~Node(Node *this)

{
  Node *this_00;
  pointer paVar1;
  pointer paVar2;
  pointer paVar3;
  pointer pcVar4;
  bool bVar5;
  pointer ppNVar6;
  ulong uVar7;
  ulong uVar8;
  
  ppNVar6 = (this->mChildren).
            super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mChildren).
      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar6) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      this_00 = ppNVar6[uVar7];
      if (this_00 != (Node *)0x0) {
        ~Node(this_00);
        operator_delete(this_00);
      }
      ppNVar6 = (this->mChildren).
                super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar8 < (ulong)((long)(this->mChildren).
                                    super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar6 >> 3)
      ;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar5);
  }
  paVar1 = (this->aCameraRollKeys).
           super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar1 != (pointer)0x0) {
    operator_delete(paVar1);
  }
  paVar2 = (this->aTargetPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2);
  }
  paVar2 = (this->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2);
  }
  paVar2 = (this->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2);
  }
  paVar3 = (this->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3);
  }
  pcVar4 = (this->mDummyName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->mDummyName).field_2) {
    operator_delete(pcVar4);
  }
  pcVar4 = (this->mName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->mName).field_2) {
    operator_delete(pcVar4);
  }
  ppNVar6 = (this->mChildren).
            super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar6 != (pointer)0x0) {
    operator_delete(ppNVar6);
    return;
  }
  return;
}

Assistant:

~Node()
    {
        for (unsigned int i = 0; i < mChildren.size();++i)
            delete mChildren[i];
    }